

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O0

void __thiscall QPushButton::setDefault(QPushButton *this,bool enable)

{
  State state;
  byte in_SIL;
  QPushButtonPrivate *in_RDI;
  long in_FS_OFFSET;
  QDialog *dlg;
  QPushButtonPrivate *d;
  QAccessibleStateChangeEvent event;
  State s;
  QDialogPrivate *in_stack_ffffffffffffffa0;
  QPushButtonPrivate *this_00;
  QAccessibleStateChangeEvent local_38 [40];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  state = (State)d_func((QPushButton *)0x665422);
  if ((*(byte *)((long)state + 0x2c8) >> 2 & 1) != (in_SIL & 1)) {
    *(byte *)((long)state + 0x2c8) = *(byte *)((long)state + 0x2c8) & 0xfb | (in_SIL & 1) << 2;
    if (((*(byte *)((long)state + 0x2c8) >> 2 & 1) != 0) &&
       (in_stack_ffffffffffffffa0 = (QDialogPrivate *)QPushButtonPrivate::dialogParent(this_00),
       in_stack_ffffffffffffffa0 != (QDialogPrivate *)0x0)) {
      QDialog::d_func((QDialog *)0x6654ad);
      QDialogPrivate::setMainDefault(in_stack_ffffffffffffffa0,(QPushButton *)in_RDI);
    }
    QWidget::update((QWidget *)in_RDI);
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QAccessible::State::State((State *)0x6654da);
    local_10 = (undefined1 *)((ulong)local_10 & 0xfffffffffffffbff | 0x400);
    memset(local_38,0xaa,0x28);
    QAccessibleStateChangeEvent::QAccessibleStateChangeEvent
              ((QAccessibleStateChangeEvent *)in_stack_ffffffffffffffa0,(QObject *)in_RDI,state);
    QAccessible::updateAccessibility((QAccessibleEvent *)local_38);
    QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent(local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPushButton::setDefault(bool enable)
{
    Q_D(QPushButton);
    if (d->defaultButton == enable)
        return;
    d->defaultButton = enable;
#if QT_CONFIG(dialog)
    if (d->defaultButton) {
        if (QDialog *dlg = d->dialogParent())
            dlg->d_func()->setMainDefault(this);
    }
#endif
    update();
#if QT_CONFIG(accessibility)
    QAccessible::State s;
    s.defaultButton = true;
    QAccessibleStateChangeEvent event(this, s);
    QAccessible::updateAccessibility(&event);
#endif
}